

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O0

bool legacy::isCallTo(LLVMNode *callNode,
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *names)

{
  StringRef name;
  StringRef name_00;
  bool bVar1;
  ret_type pFVar2;
  size_t sVar3;
  set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
  *psVar4;
  iterator names_00;
  reference ppLVar5;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *in_RDI;
  Function *func_1;
  LLVMNode *entry;
  LLVMDependenceGraph *dg;
  iterator __end1;
  iterator __begin1;
  set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
  *__range1;
  Function *func;
  Value *calledValue;
  CallInst *callInst;
  set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
  *in_stack_ffffffffffffff78;
  Value *in_stack_ffffffffffffff80;
  _Self local_60;
  _Self in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  bool local_1;
  
  ::dg::LLVMNode::getValue((LLVMNode *)0x1e26ab);
  bVar1 = llvm::isa<llvm::CallInst,llvm::Value*>((Value **)0x1e26ba);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    bVar1 = ::dg::Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::hasSubgraphs
                      ((Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)0x1e26d9);
    if (bVar1) {
      psVar4 = ::dg::Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getSubgraphs
                         (in_RDI);
      names_00 = std::
                 set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
                 ::begin(in_stack_ffffffffffffff78);
      local_60._M_node =
           (_Base_ptr)
           std::
           set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
           ::end(in_stack_ffffffffffffff78);
      bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffa8,&local_60);
      if (bVar1) {
        ppLVar5 = std::_Rb_tree_const_iterator<dg::LLVMDependenceGraph_*>::operator*
                            ((_Rb_tree_const_iterator<dg::LLVMDependenceGraph_*> *)0x1e27b5);
        ::dg::DependenceGraph<dg::LLVMNode>::getEntry((DependenceGraph<dg::LLVMNode> *)*ppLVar5);
        ::dg::LLVMNode::getValue((LLVMNode *)0x1e27d6);
        llvm::Value::stripPointerCasts((Value *)0x1e27de);
        llvm::cast<llvm::Function,llvm::Value>((Value *)0x1e27e6);
        llvm::Value::getName();
        name_00.Length = in_stack_ffffffffffffffb8;
        name_00.Data = (char *)psVar4;
        local_1 = array_match<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                            (name_00,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)names_00._M_node);
      }
      else {
        local_1 = false;
      }
    }
    else {
      ::dg::LLVMNode::getValue((LLVMNode *)0x1e26eb);
      llvm::cast<llvm::CallInst,llvm::Value>((Value *)0x1e26f3);
      llvm::CallBase::getCalledOperand((CallBase *)0x1e2702);
      llvm::Value::stripPointerCasts();
      pFVar2 = llvm::dyn_cast<llvm::Function,llvm::Value_const>(in_stack_ffffffffffffff80);
      if (pFVar2 == (ret_type)0x0) {
        local_1 = false;
      }
      else {
        sVar3 = llvm::Value::getName();
        name.Length = sVar3;
        name.Data = in_stack_ffffffffffffffb0;
        local_1 = array_match<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                            (name,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)in_stack_ffffffffffffffa8._M_node);
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool isCallTo(LLVMNode *callNode, const std::set<std::string> &names) {
    using namespace llvm;

    if (!isa<llvm::CallInst>(callNode->getValue())) {
        return false;
    }

    // if the function is undefined, it has no subgraphs,
    // but is not called via function pointer
    if (!callNode->hasSubgraphs()) {
        const CallInst *callInst = cast<CallInst>(callNode->getValue());
#if LLVM_VERSION_MAJOR >= 8
        const Value *calledValue = callInst->getCalledOperand();
#else
        const Value *calledValue = callInst->getCalledValue();
#endif
        const Function *func =
                dyn_cast<Function>(calledValue->stripPointerCasts());
        // in the case we haven't run points-to analysis
        if (!func)
            return false;

        return array_match(func->getName(), names);
    } // simply iterate over the subgraphs, get the entry node
    // and check it
    for (LLVMDependenceGraph *dg : callNode->getSubgraphs()) {
        LLVMNode *entry = dg->getEntry();
        assert(entry && "No entry node in graph");

        const Function *func =
                cast<Function>(entry->getValue()->stripPointerCasts());
        return array_match(func->getName(), names);
    }

    return false;
}